

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O2

long * __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::at
          (KDTree<phosg::Vector2<long>,_long> *this,Vector2<long> *pt)

{
  Node *pNVar1;
  out_of_range *this_00;
  
  while( true ) {
    pNVar1 = this->root;
    if (pNVar1 == (Node *)0x0) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      ::std::out_of_range::out_of_range(this_00,"no such item");
      __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
    }
    if (((pNVar1->pt).field_0.x == (pt->field_0).x) && ((pNVar1->pt).field_1.y == (pt->field_1).y))
    break;
    this = (KDTree<phosg::Vector2<long>,_long> *)
           (&pNVar1->before +
           ((&(pNVar1->pt).field_0)[pNVar1->dim].x <= (&pt->field_0)[pNVar1->dim].x));
  }
  return &pNVar1->value;
}

Assistant:

const ValueType& KDTree<CoordType, ValueType>::at(
    const CoordType& pt) const {
  for (Node* n = this->root; n;) {
    if (n->pt == pt) {
      return n->value;
    }
    n = (pt.at(n->dim) < n->pt.at(n->dim)) ? n->before : n->after_or_equal;
  }
  throw std::out_of_range("no such item");
}